

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O0

void juzzlin::StreamTest::testTimestampMode_none_shouldNotPrintTimestamp(string *message)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream ss;
  allocator<char> local_1c9;
  string local_1c8 [24];
  allocator<char> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  stringstream local_190 [16];
  ostream local_180 [120];
  string *in_stack_fffffffffffffef8;
  stringstream *in_stack_ffffffffffffff00;
  
  juzzlin::SimpleLogger::setTimestampMode(None);
  std::__cxx11::stringstream::stringstream(local_190);
  juzzlin::SimpleLogger::setStream(Info,local_180);
  juzzlin::SimpleLogger::setLoggingLevel(Info);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&stack0xfffffffffffffe58);
  poVar1 = (ostream *)juzzlin::SimpleLogger::info_abi_cxx11_();
  std::operator<<(poVar1,in_RDI);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&stack0xfffffffffffffe58);
  assertString(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  assertNotString(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void testTimestampMode_none_shouldNotPrintTimestamp(const std::string & message)
{
    L::setTimestampMode(L::TimestampMode::None);
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L::setLoggingLevel(L::Level::Info);
    L().info() << message;
    assertString(ss, message);
    assertNotString(ss, "##");
}